

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall
wasm::OptimizeInstructions::visitStructSet(OptimizeInstructions *this,StructSet *curr)

{
  Expression **input;
  ulong uVar1;
  bool bVar2;
  HeapTypeKind HVar3;
  uint bytes;
  Shareability SVar4;
  Struct *pSVar5;
  HeapType local_30;
  HeapType heapType;
  
  input = &curr->ref;
  skipNonNullCast(this,input,(Expression *)curr);
  bVar2 = trapOnNull(this,(Expression *)curr,input);
  if (!bVar2) {
    if ((((*input)->type).id != 1) && (((curr->value->type).id & 0xfffffffffffffffe) == 2)) {
      local_30 = wasm::Type::getHeapType(&(*input)->type);
      HVar3 = HeapType::getKind(&local_30);
      if (HVar3 == Struct) {
        pSVar5 = HeapType::getStruct(&local_30);
        bytes = Field::getByteSize((pSVar5->fields).
                                   super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                   _M_impl.super__Vector_impl_data._M_start + curr->index);
        optimizeStoredValue(this,&curr->value,bytes);
      }
    }
    if ((curr->order == AcqRel) && (uVar1 = ((*input)->type).id, (uVar1 & 1) == 0 && 6 < uVar1)) {
      local_30 = wasm::Type::getHeapType(&(*input)->type);
      SVar4 = HeapType::getShared(&local_30);
      if (SVar4 != Shared) {
        curr->order = Unordered;
      }
    }
  }
  return;
}

Assistant:

void visitStructSet(StructSet* curr) {
    skipNonNullCast(curr->ref, curr);
    if (trapOnNull(curr, curr->ref)) {
      return;
    }

    if (curr->ref->type != Type::unreachable && curr->value->type.isInteger()) {
      // We must avoid the case of a null type.
      auto heapType = curr->ref->type.getHeapType();
      if (heapType.isStruct()) {
        const auto& fields = heapType.getStruct().fields;
        optimizeStoredValue(curr->value, fields[curr->index].getByteSize());
      }
    }

    // Relax release stores of unshared fields to unordered because they cannot
    // synchronize with other threads.
    if (curr->order == MemoryOrder::AcqRel && curr->ref->type.isRef() &&
        !curr->ref->type.getHeapType().isShared()) {
      curr->order = MemoryOrder::Unordered;
    }
  }